

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::reciprocal
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this)

{
  MatrixXd *lhs;
  VectorXd c;
  vectype local_f0;
  undefined1 local_e0 [16];
  ChebyshevExpansion *local_d0;
  double local_c8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_c0;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_0>
  local_90;
  Rhs local_58;
  
  lhs = LMatrixLibrary::get((LMatrixLibrary *)l_matrix_library,
                            (this->m_c).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_rows - 1);
  local_c8 = 1.0;
  get_node_function_values((ChebyshevExpansion *)local_e0);
  local_d0 = (ChebyshevExpansion *)local_e0;
  Eigen::operator/(&local_c0,&local_c8,(StorageBaseType *)&local_d0);
  local_58.m_expression.m_lhs.m_rows.m_value = local_c0.m_lhs.m_rows.m_value;
  local_58.m_expression.m_lhs.m_functor.m_other = local_c0.m_lhs.m_functor.m_other;
  local_58.m_expression.m_rhs.m_expression = local_c0.m_rhs.m_expression;
  Eigen::
  Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>,_0>
  ::Product(&local_90,lhs,&local_58);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>const>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_f0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_0>_>
              *)&local_90);
  free((void *)local_e0._0_8_);
  ChebyshevExpansion(__return_storage_ptr__,&local_f0,this->m_xmin,this->m_xmax);
  free(local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::reciprocal() const{
        // 1. Transform Chebyshev-Lobatto node function values by the function f(y) -> 1/y
        // 2. Go backwards to coefficients from node values c2 = V/y
        const auto Ndegree = m_c.size() - 1;
        const Eigen::MatrixXd& V = l_matrix_library.get(Ndegree);
        // Values at the nodes in the x range of [-1, 1]
        Eigen::VectorXd c = V*(1.0/get_node_function_values().array()).matrix();
        
        return ChebyshevExpansion(c, xmin(), xmax());
    }